

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O2

JavascriptString * __thiscall Js::RuntimeFunction::EnsureSourceString(RuntimeFunction *this)

{
  Type *this_00;
  Var aValue;
  JavascriptLibrary *pJVar1;
  ScriptContext *this_01;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int32 propertyId;
  JavascriptString *pJVar5;
  DynamicTypeHandler *pDVar6;
  undefined4 *puVar7;
  PropertyString *name;
  JavascriptString *local_30;
  JavascriptString *functionName;
  
  aValue = (this->functionNameId).ptr;
  if (this->isDisplayString == true) {
    pJVar5 = VarTo<Js::JavascriptString>(aValue);
    return pJVar5;
  }
  pJVar1 = (((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr)->
           javascriptLibrary).ptr;
  this_00 = &this->functionNameId;
  if (aValue == (Var)0x0) {
    pJVar5 = StringCache::GetFunctionDisplay(&pJVar1->stringCache);
  }
  else {
    this_01 = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
    pDVar6 = DynamicObject::GetTypeHandler((DynamicObject *)this);
    iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x4d])(pDVar6);
    if (iVar4 != 0) {
      local_30 = (JavascriptString *)0x0;
      bVar3 = JavascriptFunction::GetFunctionName(&this->super_JavascriptFunction,&local_30);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                    ,0x2a,"(status)","status");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
                (this,0x106,local_30,2,0,0,0xf);
    }
    bVar3 = TaggedInt::Is(this_00->ptr);
    if (bVar3) {
      propertyId = TaggedInt::ToInt32(this_00->ptr);
      name = ScriptContext::GetPropertyString(this_01,propertyId);
    }
    else {
      name = (PropertyString *)VarTo<Js::JavascriptString>(this_00->ptr);
    }
    pJVar5 = JavascriptFunction::GetNativeFunctionDisplayString
                       (this_01,&name->super_JavascriptString);
  }
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_00,pJVar5);
  this->isDisplayString = true;
  return pJVar5;
}

Assistant:

JavascriptString *
    RuntimeFunction::EnsureSourceString()
    {
        JavascriptLibrary* library = this->GetLibrary();
        ScriptContext * scriptContext = library->GetScriptContext();
        JavascriptString * retStr = nullptr;
        if (this->isDisplayString)
        {
            return VarTo<JavascriptString>(this->functionNameId);
        }

        if (this->functionNameId == nullptr)
        {
            retStr = library->GetFunctionDisplayString();
        }
        else
        {
            if (this->GetTypeHandler()->IsDeferredTypeHandler())
            {
                JavascriptString* functionName = nullptr;
                DebugOnly(bool status = ) this->GetFunctionName(&functionName);
                Assert(status);
                this->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
            if (TaggedInt::Is(this->functionNameId))
            {
                // This has a side-effect where any other code (such as debugger) that uses functionNameId value will now get the value like "function foo() { native code }"
                // instead of just "foo". Alternative ways will need to be devised; if it's not desirable to use this full display name value in those cases.
                retStr = GetNativeFunctionDisplayString(scriptContext, scriptContext->GetPropertyString(TaggedInt::ToInt32(this->functionNameId)));
            }
            else
            {
                retStr = GetNativeFunctionDisplayString(scriptContext, VarTo<JavascriptString>(this->functionNameId));
            }
        }

        this->functionNameId = retStr;
        this->isDisplayString = true;

        return retStr;
    }